

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5d835d::Db::parseConversionExpr(Db *this)

{
  bool bVar1;
  Node **ppNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  char *pcVar5;
  undefined8 *puVar6;
  Node *pNVar7;
  char *pcVar8;
  NodeArray NVar9;
  Node *E;
  Node *local_38;
  
  local_38 = (Node *)this->First;
  if ((ulong)((long)this->Last - (long)local_38) < 2) {
    return (Node *)0x0;
  }
  if (*(short *)&local_38->_vptr_Node == 0x7663) {
    this->First = (char *)((long)&local_38->_vptr_Node + 2);
    bVar1 = this->TryToParseTemplateArgs;
    this->TryToParseTemplateArgs = false;
    pNVar4 = parseType(this);
    this->TryToParseTemplateArgs = bVar1;
    if (pNVar4 != (Node *)0x0) {
      pcVar5 = this->First;
      pcVar8 = this->Last;
      if ((pcVar5 == pcVar8) || (*pcVar5 != '_')) {
        pNVar7 = parseExpr(this);
        if (pNVar7 != (Node *)0x0) {
          puVar6 = (undefined8 *)BumpPointerAllocator::allocate(&this->ASTAllocator,8);
          *puVar6 = pNVar7;
          pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar7->K = KExpr;
          pNVar7->RHSComponentCache = No;
          pNVar7->ArrayCache = No;
          pNVar7->FunctionCache = No;
          pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023dc58;
          pNVar7[1]._vptr_Node = (_func_int **)pNVar4;
          *(undefined8 **)&pNVar7[1].K = puVar6;
          pNVar7[2]._vptr_Node = (_func_int **)0x1;
          return pNVar7;
        }
      }
      else {
        pcVar5 = pcVar5 + 1;
        this->First = pcVar5;
        ppNVar2 = (this->Names).Last;
        ppNVar3 = (this->Names).First;
        while( true ) {
          if ((pcVar5 != pcVar8) && (*pcVar5 == 'E')) {
            this->First = pcVar5 + 1;
            NVar9 = popTrailingNodeArray(this,(long)ppNVar2 - (long)ppNVar3 >> 3);
            pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
            pNVar7->K = KExpr;
            pNVar7->RHSComponentCache = No;
            pNVar7->ArrayCache = No;
            pNVar7->FunctionCache = No;
            pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023dc58;
            pNVar7[1]._vptr_Node = (_func_int **)pNVar4;
            *(NodeArray *)&pNVar7[1].K = NVar9;
            return pNVar7;
          }
          local_38 = parseExpr(this);
          if (local_38 == (Node *)0x0) break;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_38);
          pcVar5 = this->First;
          pcVar8 = this->Last;
        }
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(StringView S) {
    if (StringView(First, Last).startsWith(S)) {
      First += S.size();
      return true;
    }
    return false;
  }